

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void processChunkShared(Image *output,uint32_t size,Type type,int width,int height,istream *file,
                       string *name,bool isSwitch)

{
  bool bVar1;
  runtime_error *prVar2;
  uint uVar3;
  Size newSize;
  ulong __new_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decompressed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chunk;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  decompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  decompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  decompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = width + 3;
  if (size == 0) {
    if (type != TYPE_INDEXED) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Expected a size-0 type to be 3 (indexed, no alpha) but it wasn\'t...");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&chunk,(ulong)(height * (uVar3 & 0xfffffffc) + 0x400),(allocator_type *)&local_50);
    std::istream::read((char *)file,
                       (long)chunk.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    getIndexed(output,&chunk,(Size)(CONCAT44(height,uVar3) & 0xfffffffffffffffc),isSwitch,0x100);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&chunk.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&compressed,(ulong)size,(allocator_type *)&chunk);
    std::istream::read((char *)file,
                       (long)compressed.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    bVar1 = decompressHigu(&decompressed,
                           compressed.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (int)compressed.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)compressed.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,isSwitch);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"Decompression of ",name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&chunk,
                     &local_50," failed");
      std::runtime_error::runtime_error(prVar2,(string *)&chunk);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&compressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    newSize = (Size)(CONCAT44(height,uVar3) & 0xfffffffffffffffc);
    if ((type & ~TYPE_COLOR) == TYPE_INDEXED_ALPHA) {
      getIndexed(output,&decompressed,newSize,isSwitch,0x100);
    }
    else {
      Image::fastResize(output,newSize);
      __new_size = (ulong)((output->size).width * (output->size).height * 4);
      if ((ulong)((long)decompressed.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)decompressed.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) < __new_size) {
        fprintf(_stderr,"Decompressed too little data for chunk, have %zd but need %d bytes!\n");
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&decompressed,__new_size)
        ;
      }
      else if (__new_size <
               (ulong)((long)decompressed.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)decompressed.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
        fprintf(_stderr,"Decompressed too much data for chunk, have %zd but only need %d bytes!\n");
      }
      getRGB(output,&decompressed,isSwitch);
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&decompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

static void processChunkShared(Image &output, uint32_t size, ChunkHeader::Type type, int width, int height, std::istream &file, const std::string &name, bool isSwitch) {
	std::vector<uint8_t> decompressed;
	Size alignedSize = align({width, height});

	// If size is zero, then we're uncompressed and paletted
	if (size == 0) {
		if (type != ChunkHeader::TYPE_INDEXED) {
			throw std::runtime_error("Expected a size-0 type to be 3 (indexed, no alpha) but it wasn't...");
		}
		size = 1024 + alignedSize.area();
		std::vector<uint8_t> chunk(size);
		file.read((char *)chunk.data(), chunk.size());
		getIndexed(output, chunk, alignedSize, isSwitch);
		return;
	}
	else {
		std::vector<uint8_t> compressed(size);
		file.read((char *)compressed.data(), compressed.size());
		if (!decompressHigu(decompressed, compressed.data(), (int)compressed.size(), isSwitch)) {
			throw std::runtime_error("Decompression of " + name + " failed");
		}
	}

	if (type == ChunkHeader::TYPE_INDEXED || type == ChunkHeader::TYPE_INDEXED_ALPHA) {
		getIndexed(output, decompressed, alignedSize, isSwitch);
	}
	else {
		output.fastResize(alignedSize);
		int byteSize = output.size.area() * sizeof(Color);
		if (decompressed.size() < byteSize) {
			fprintf(stderr, "Decompressed too little data for chunk, have %zd but need %d bytes!\n", decompressed.size(), byteSize);
			decompressed.resize(byteSize);
		}
		else if (decompressed.size() > byteSize) {
			fprintf(stderr, "Decompressed too much data for chunk, have %zd but only need %d bytes!\n", decompressed.size(), byteSize);
		}
		getRGB(output, decompressed, isSwitch);
	}
}